

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix3f.cpp
# Opt level: O1

void __thiscall Matrix3f::transpose(Matrix3f *this)

{
  float fVar1;
  float *pfVar2;
  long lVar3;
  long lVar4;
  float *pfVar5;
  float *pfVar6;
  bool bVar7;
  
  pfVar2 = this->m_elements + 3;
  pfVar5 = this->m_elements + 1;
  lVar3 = 0;
  do {
    lVar4 = -2;
    pfVar6 = pfVar2;
    do {
      fVar1 = *pfVar6;
      *pfVar6 = pfVar5[lVar4 + 2];
      pfVar5[lVar4 + 2] = fVar1;
      pfVar6 = pfVar6 + 3;
      lVar4 = lVar4 + 1;
    } while (lVar3 + lVar4 != 0);
    pfVar2 = pfVar2 + 4;
    pfVar5 = pfVar5 + 4;
    bVar7 = lVar3 == 0;
    lVar3 = lVar3 + 1;
  } while (bVar7);
  return;
}

Assistant:

void Matrix3f::transpose()
{
	float temp;

	for( int i = 0; i < 2; ++i )
	{
		for( int j = i + 1; j < 3; ++j )
		{
			temp = ( *this )( i, j );
			( *this )( i, j ) = ( *this )( j, i );
			( *this )( j, i ) = temp;
		}
	}
}